

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_test(OpenJTalk *oj,void *text)

{
  _Bool _Var1;
  OpenJTalk *in_RSI;
  long in_RDI;
  char *temp_charSjis;
  char *temp_char_utf8;
  char16_t *temp_char16;
  int i;
  char *temp_char;
  _Bool temp;
  char16_t *in_stack_ffffffffffffffb8;
  OpenJTalk *in_stack_ffffffffffffffc0;
  int local_24;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    g_psd->data = (short *)0x0;
    _Var1 = (_Bool)(g_verbose & 1);
    g_verbose = true;
    fprintf(_stderr,"***** test start *****\n");
    if (in_RSI == (OpenJTalk *)0x0) {
      openjtalk_speakSync(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    }
    else {
      fprintf(_stderr,"* hex dump\n");
      for (local_24 = 0; local_24 < 0x80; local_24 = local_24 + 1) {
        fprintf(_stderr,"%02x ",(ulong)(byte)in_RSI->dn_dic_path[(long)local_24 + -8]);
        if (local_24 % 0x10 == 0xf) {
          fprintf(_stderr,"\n");
        }
      }
      fprintf(_stderr,"\n");
      fprintf(_stderr,"* encoding in UTF-16le\n");
      openjtalk_speakSyncU16(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      fprintf(_stderr,"* encoding in UTF-8\n");
      openjtalk_speakSync(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
      fprintf(_stderr,"* encoding in SHIFT_JIS\n");
      openjtalk_speakSyncSjis(in_RSI,(char *)in_stack_ffffffffffffffb8);
    }
    fprintf(_stderr,"***** finished *****\n\n");
    g_verbose = _Var1;
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_test(OpenJTalk *oj, void *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	g_psd->data = NULL;

	bool temp = g_verbose;
	g_verbose = true;
	fprintf(stderr, u8"***** test start *****\n");

	if (text != NULL)
	{
		fprintf(stderr, u8"* hex dump\n");
		char *temp_char = (char *)text;
		for (int i = 0; i <= 127; i++)
		{
			fprintf(stderr, u8"%02x ", temp_char[i] & 0xff);
			if (i % 16 == 15)
			{
				fprintf(stderr, u8"\n");
			}
		}
		fprintf(stderr, u8"\n");

		fprintf(stderr, u8"* encoding in UTF-16le\n");
		char16_t *temp_char16 = (char16_t *)text;
		openjtalk_speakSyncU16(oj, temp_char16);

		fprintf(stderr, u8"* encoding in UTF-8\n");
		char *temp_char_utf8 = (char *)text;
		openjtalk_speakSync(oj, temp_char_utf8);

		fprintf(stderr, u8"* encoding in SHIFT_JIS\n");
		char *temp_charSjis = (char *)text;
		openjtalk_speakSyncSjis(oj, temp_charSjis);
	}
	else
	{
		openjtalk_speakSync(oj, u8"聞こえますか？");
	}
	fprintf(stderr, u8"***** finished *****\n\n");
	g_verbose = temp;
}